

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::NeuralNetwork::Clear(NeuralNetwork *this)

{
  NetworkUpdateParameters *this_00;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  NeuralNetwork *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Clear
            (&this->layers_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::Clear
            (&this->preprocessing_);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->updateparams_ != (NetworkUpdateParameters *)0x0)) &&
     (this_00 = this->updateparams_, this_00 != (NetworkUpdateParameters *)0x0)) {
    NetworkUpdateParameters::~NetworkUpdateParameters(this_00);
    operator_delete(this_00,0x50);
  }
  this->updateparams_ = (NetworkUpdateParameters *)0x0;
  memset(&this->arrayinputshapemapping_,0,8);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void NeuralNetwork::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NeuralNetwork)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  layers_.Clear();
  preprocessing_.Clear();
  if (GetArenaForAllocation() == nullptr && updateparams_ != nullptr) {
    delete updateparams_;
  }
  updateparams_ = nullptr;
  ::memset(&arrayinputshapemapping_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&imageinputshapemapping_) -
      reinterpret_cast<char*>(&arrayinputshapemapping_)) + sizeof(imageinputshapemapping_));
  _internal_metadata_.Clear<std::string>();
}